

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

yajl_val context_pop(context_t *ctx)

{
  void *__ptr;
  long *in_RDI;
  yajl_val v;
  stack_elem_t *stack;
  yajl_val local_8;
  
  if (*in_RDI == 0) {
    if (in_RDI[2] != 0) {
      snprintf((char *)in_RDI[2],in_RDI[3],"context_pop: Bottom of stack reached prematurely");
    }
    local_8 = (yajl_val)0x0;
  }
  else {
    __ptr = (void *)*in_RDI;
    *in_RDI = *(long *)((long)__ptr + 0x10);
    local_8 = *(yajl_val *)((long)__ptr + 8);
    free(__ptr);
  }
  return local_8;
}

Assistant:

static yajl_val context_pop(context_t *ctx)
{
    stack_elem_t *stack;
    yajl_val v;

    if (ctx->stack == NULL)
        RETURN_ERROR (ctx, NULL, "context_pop: "
                      "Bottom of stack reached prematurely");

    stack = ctx->stack;
    ctx->stack = stack->next;

    v = stack->value;

    free (stack);

    return (v);
}